

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression *
slang::ast::CopyClassExpression::fromSyntax
          (Compilation *compilation,CopyClassExpressionSyntax *syntax,ASTContext *context)

{
  Type *args;
  bool bVar1;
  Expression *pEVar2;
  CopyClassExpression *expr;
  Diagnostic *diag;
  SourceRange local_38;
  
  pEVar2 = Expression::selfDetermined
                     (compilation,(syntax->expr).ptr,context,(bitmask<slang::ast::ASTFlags>)0x0);
  args = (pEVar2->type).ptr;
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::CopyClassExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,pEVar2,&local_38);
  bVar1 = Expression::bad(pEVar2);
  if (!bVar1) {
    bVar1 = Type::isClass((pEVar2->type).ptr);
    if (bVar1) {
      return &expr->super_Expression;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x440007,pEVar2->sourceRange);
    ast::operator<<(diag,(pEVar2->type).ptr);
  }
  pEVar2 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar2;
}

Assistant:

Expression& CopyClassExpression::fromSyntax(Compilation& compilation,
                                            const CopyClassExpressionSyntax& syntax,
                                            const ASTContext& context) {
    auto& source = selfDetermined(compilation, *syntax.expr, context);
    auto result = compilation.emplace<CopyClassExpression>(*source.type, source,
                                                           syntax.sourceRange());
    if (source.bad())
        return badExpr(compilation, result);

    if (!source.type->isClass()) {
        context.addDiag(diag::CopyClassTarget, source.sourceRange) << *source.type;
        return badExpr(compilation, result);
    }

    return *result;
}